

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteString.cpp
# Opt level: O3

ByteString * __thiscall ByteString::operator+=(ByteString *this,ByteString *append)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  pointer puVar4;
  size_t __n;
  
  puVar1 = (this->byteString).super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  puVar2 = (this->byteString).super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar3 = (append->byteString).super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  puVar4 = (append->byteString).super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  std::vector<unsigned_char,_SecureAllocator<unsigned_char>_>::resize
            (&this->byteString,(size_type)(puVar1 + (long)(puVar3 + (-(long)puVar4 - (long)puVar2)))
            );
  __n = (long)puVar3 - (long)puVar4;
  if (__n != 0) {
    memcpy(puVar1 + ((long)(this->byteString).
                           super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_start - (long)puVar2),
           (append->byteString).super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start,__n);
  }
  return this;
}

Assistant:

ByteString& ByteString::operator+=(const ByteString& append)
{
	size_t curLen = byteString.size();
	size_t toAdd = append.byteString.size();
	size_t newLen = curLen + toAdd;

	byteString.resize(newLen);

	if (toAdd > 0)
		memcpy(&byteString[curLen], &append.byteString[0], toAdd);

	return *this;
}